

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall cmGlobalUnixMakefileGenerator3::Generate(cmGlobalUnixMakefileGenerator3 *this)

{
  bool bVar1;
  reference ppVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  reference ppcVar3;
  string *psVar4;
  size_t sVar5;
  ostream *poVar6;
  undefined1 local_2f8 [8];
  cmGeneratedFileStream markFile;
  undefined1 local_a0 [8];
  string markFileName;
  cmLocalGenerator *lg;
  iterator __end1_2;
  iterator __begin1_2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1_2;
  pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress> *pmi_1;
  iterator __end1_1;
  iterator __begin1_1;
  ProgressMapType *__range1_1;
  unsigned_long current;
  pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress> *pmi;
  iterator __end1;
  iterator __begin1;
  ProgressMapType *__range1;
  unsigned_long total;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
  __range1 = (ProgressMapType *)0x0;
  __end1 = std::
           map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
           ::begin(&this->ProgressMap);
  pmi = (pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress> *)
        std::
        map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
        ::end(&this->ProgressMap);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&pmi);
    if (!bVar1) break;
    current = (unsigned_long)
              std::
              _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
              ::operator*(&__end1);
    __range1 = (ProgressMapType *)
               (&(__range1->_M_t)._M_impl.field_0x0 + (((reference)current)->second).NumberOfActions
               );
    std::
    _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
    ::operator++(&__end1);
  }
  __range1_1 = (ProgressMapType *)0x0;
  __end1_1 = std::
             map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
             ::begin(&this->ProgressMap);
  pmi_1 = (pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress> *)
          std::
          map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
          ::end(&this->ProgressMap);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,(_Self *)&pmi_1);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
             ::operator*(&__end1_1);
    TargetProgress::WriteProgressVariables
              (&ppVar2->second,(unsigned_long)__range1,(unsigned_long *)&__range1_1);
    std::
    _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
    ::operator++(&__end1_1);
  }
  this_00 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
  __end1_2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(this_00);
  lg = (cmLocalGenerator *)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&lg);
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1_2);
    markFileName.field_2._8_8_ = *ppcVar3;
    psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)markFileName.field_2._8_8_);
    std::__cxx11::string::string((string *)local_a0,(string *)psVar4);
    std::__cxx11::string::operator+=((string *)local_a0,"/");
    std::__cxx11::string::operator+=((string *)local_a0,"/CMakeFiles");
    std::__cxx11::string::operator+=((string *)local_a0,"/progress.marks");
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_2f8,(string *)local_a0,false,None);
    sVar5 = CountProgressMarksInAll(this,(cmLocalGenerator *)markFileName.field_2._8_8_);
    poVar6 = (ostream *)std::ostream::operator<<(local_2f8,sVar5);
    std::operator<<(poVar6,"\n");
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2f8);
    std::__cxx11::string::~string((string *)local_a0);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1_2);
  }
  WriteMainMakefile2(this);
  WriteMainCMakefile(this);
  if (this->CommandDatabase != (cmGeneratedFileStream *)0x0) {
    poVar6 = (ostream *)
             std::ostream::operator<<(this->CommandDatabase,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar6,"]");
    if (this->CommandDatabase != (cmGeneratedFileStream *)0x0) {
      (*(this->CommandDatabase->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream[1])();
    }
    this->CommandDatabase = (cmGeneratedFileStream *)0x0;
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::Generate()
{
  // first do superclass method
  this->cmGlobalGenerator::Generate();

  // initialize progress
  unsigned long total = 0;
  for (auto const& pmi : this->ProgressMap) {
    total += pmi.second.NumberOfActions;
  }

  // write each target's progress.make this loop is done twice. Bascially the
  // Generate pass counts all the actions, the first loop below determines
  // how many actions have progress updates for each target and writes to
  // corrrect variable values for everything except the all targets. The
  // second loop actually writes out correct values for the all targets as
  // well. This is because the all targets require more information that is
  // computed in the first loop.
  unsigned long current = 0;
  for (auto& pmi : this->ProgressMap) {
    pmi.second.WriteProgressVariables(total, current);
  }
  for (cmLocalGenerator* lg : this->LocalGenerators) {
    std::string markFileName = lg->GetCurrentBinaryDirectory();
    markFileName += "/";
    markFileName += "/CMakeFiles";
    markFileName += "/progress.marks";
    cmGeneratedFileStream markFile(markFileName);
    markFile << this->CountProgressMarksInAll(lg) << "\n";
  }

  // write the main makefile
  this->WriteMainMakefile2();
  this->WriteMainCMakefile();

  if (this->CommandDatabase != nullptr) {
    *this->CommandDatabase << std::endl << "]";
    delete this->CommandDatabase;
    this->CommandDatabase = nullptr;
  }
}